

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O1

void secp256k1_hsort(void *ptr,size_t count,size_t size,_func_int_void_ptr_void_ptr_void_ptr *cmp,
                    void *cmp_data)

{
  long lVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  undefined8 *puVar12;
  ulong uVar13;
  ulong uVar14;
  uchar *b_1;
  void *pvVar15;
  long lVar16;
  uchar *a;
  void *pvVar17;
  uchar *b_2;
  long lVar18;
  long lVar19;
  size_t sVar20;
  bool bVar21;
  uchar *a_2;
  uchar *b;
  uchar tmp [64];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_50;
  undefined8 *local_48;
  ulong local_40;
  size_t local_38;
  
  if (1 < count) {
    local_50 = count >> 1;
    local_48 = (undefined8 *)((long)ptr + -0x40);
    local_40 = local_50;
    local_38 = count;
    do {
      uVar13 = local_50 - 1;
      local_50 = uVar13;
      if (uVar13 < local_40) {
        do {
          uVar3 = uVar13 * 2;
          uVar14 = uVar13 * 2 + 2;
          if (uVar14 < count) {
            pvVar15 = (void *)(uVar14 * size + (long)ptr);
            iVar11 = (*cmp)(pvVar15,(void *)((uVar3 | 1) * size + (long)ptr),cmp_data);
            if (iVar11 < 0) goto LAB_00117eb2;
            pvVar17 = (void *)(uVar13 * size + (long)ptr);
            iVar11 = (*cmp)(pvVar15,pvVar17,cmp_data);
            if (iVar11 < 1) break;
            sVar20 = size;
            if (0x40 < size) {
              lVar18 = (uVar3 + 3) * size + (long)local_48;
              lVar16 = (uVar13 + 1) * size + (long)local_48;
              lVar19 = 0;
              do {
                local_98 = *(undefined8 *)(lVar16 + lVar19);
                uStack_90 = ((undefined8 *)(lVar16 + lVar19))[1];
                puVar12 = (undefined8 *)(lVar16 + 0x10 + lVar19);
                local_88 = *puVar12;
                uStack_80 = puVar12[1];
                puVar12 = (undefined8 *)(lVar16 + 0x20 + lVar19);
                local_78 = *puVar12;
                uStack_70 = puVar12[1];
                puVar12 = (undefined8 *)(lVar16 + 0x30 + lVar19);
                local_68 = *puVar12;
                uStack_60 = puVar12[1];
                uVar4 = ((undefined8 *)(lVar18 + lVar19))[1];
                puVar12 = (undefined8 *)(lVar18 + 0x10 + lVar19);
                uVar5 = *puVar12;
                uVar6 = puVar12[1];
                puVar12 = (undefined8 *)(lVar18 + 0x20 + lVar19);
                uVar7 = *puVar12;
                uVar8 = puVar12[1];
                puVar12 = (undefined8 *)(lVar18 + 0x30 + lVar19);
                uVar9 = *puVar12;
                uVar10 = puVar12[1];
                *(undefined8 *)(lVar16 + lVar19) = *(undefined8 *)(lVar18 + lVar19);
                ((undefined8 *)(lVar16 + lVar19))[1] = uVar4;
                puVar12 = (undefined8 *)(lVar16 + 0x30 + lVar19);
                *puVar12 = uVar9;
                puVar12[1] = uVar10;
                puVar12 = (undefined8 *)(lVar16 + 0x20 + lVar19);
                *puVar12 = uVar7;
                puVar12[1] = uVar8;
                puVar12 = (undefined8 *)(lVar16 + 0x10 + lVar19);
                *puVar12 = uVar5;
                puVar12[1] = uVar6;
                puVar12 = (undefined8 *)(lVar18 + 0x30 + lVar19);
                *puVar12 = local_68;
                puVar12[1] = uStack_60;
                puVar12 = (undefined8 *)(lVar18 + 0x20 + lVar19);
                *puVar12 = local_78;
                puVar12[1] = uStack_70;
                puVar12 = (undefined8 *)(lVar18 + 0x10 + lVar19);
                *puVar12 = local_88;
                puVar12[1] = uStack_80;
                *(undefined8 *)(lVar18 + lVar19) = local_98;
                ((undefined8 *)(lVar18 + lVar19))[1] = uStack_90;
                lVar1 = size + lVar19;
                lVar19 = lVar19 + -0x40;
              } while (0x40 < lVar1 - 0x40U);
              sVar20 = lVar19 + size;
            }
            memcpy(&local_98,pvVar17,sVar20);
            memmove(pvVar17,pvVar15,sVar20);
            memcpy(pvVar15,&local_98,sVar20);
            uVar13 = uVar14;
          }
          else {
LAB_00117eb2:
            pvVar15 = (void *)((uVar3 | 1) * size + (long)ptr);
            pvVar17 = (void *)(uVar13 * size + (long)ptr);
            iVar11 = (*cmp)(pvVar15,pvVar17,cmp_data);
            if (iVar11 < 1) break;
            sVar20 = size;
            if (0x40 < size) {
              lVar18 = uVar14 * size + (long)local_48;
              lVar16 = (uVar13 + 1) * size + (long)local_48;
              lVar19 = 0;
              do {
                local_98 = *(undefined8 *)(lVar16 + lVar19);
                uStack_90 = ((undefined8 *)(lVar16 + lVar19))[1];
                puVar12 = (undefined8 *)(lVar16 + 0x10 + lVar19);
                local_88 = *puVar12;
                uStack_80 = puVar12[1];
                puVar12 = (undefined8 *)(lVar16 + 0x20 + lVar19);
                local_78 = *puVar12;
                uStack_70 = puVar12[1];
                puVar12 = (undefined8 *)(lVar16 + 0x30 + lVar19);
                local_68 = *puVar12;
                uStack_60 = puVar12[1];
                uVar4 = ((undefined8 *)(lVar18 + lVar19))[1];
                puVar12 = (undefined8 *)(lVar18 + 0x10 + lVar19);
                uVar5 = *puVar12;
                uVar6 = puVar12[1];
                puVar12 = (undefined8 *)(lVar18 + 0x20 + lVar19);
                uVar7 = *puVar12;
                uVar8 = puVar12[1];
                puVar12 = (undefined8 *)(lVar18 + 0x30 + lVar19);
                uVar9 = *puVar12;
                uVar10 = puVar12[1];
                *(undefined8 *)(lVar16 + lVar19) = *(undefined8 *)(lVar18 + lVar19);
                ((undefined8 *)(lVar16 + lVar19))[1] = uVar4;
                puVar12 = (undefined8 *)(lVar16 + 0x30 + lVar19);
                *puVar12 = uVar9;
                puVar12[1] = uVar10;
                puVar12 = (undefined8 *)(lVar16 + 0x20 + lVar19);
                *puVar12 = uVar7;
                puVar12[1] = uVar8;
                puVar12 = (undefined8 *)(lVar16 + 0x10 + lVar19);
                *puVar12 = uVar5;
                puVar12[1] = uVar6;
                puVar12 = (undefined8 *)(lVar18 + 0x30 + lVar19);
                *puVar12 = local_68;
                puVar12[1] = uStack_60;
                puVar12 = (undefined8 *)(lVar18 + 0x20 + lVar19);
                *puVar12 = local_78;
                puVar12[1] = uStack_70;
                puVar12 = (undefined8 *)(lVar18 + 0x10 + lVar19);
                *puVar12 = local_88;
                puVar12[1] = uStack_80;
                *(undefined8 *)(lVar18 + lVar19) = local_98;
                ((undefined8 *)(lVar18 + lVar19))[1] = uStack_90;
                lVar1 = size + lVar19;
                lVar19 = lVar19 + -0x40;
              } while (0x40 < lVar1 - 0x40U);
              sVar20 = lVar19 + size;
            }
            memcpy(&local_98,pvVar17,sVar20);
            memmove(pvVar17,pvVar15,sVar20);
            memcpy(pvVar15,&local_98,sVar20);
            uVar13 = uVar3 | 1;
          }
          count = local_38;
        } while (uVar13 < local_40);
      }
    } while (local_50 != 0);
  }
  if (1 < count) {
    local_48 = (undefined8 *)((long)ptr + size * count + -0x40);
    local_50 = -size;
    do {
      puVar12 = local_48;
      uVar14 = size;
      uVar13 = size;
      if (0x40 < size) {
        do {
          uVar13 = uVar14 - 0x40;
          puVar2 = (undefined8 *)((long)ptr + (uVar14 - 0x40));
          local_98 = *puVar2;
          uStack_90 = puVar2[1];
          puVar2 = (undefined8 *)((long)ptr + (uVar14 - 0x30));
          local_88 = *puVar2;
          uStack_80 = puVar2[1];
          puVar2 = (undefined8 *)((long)ptr + (uVar14 - 0x20));
          local_78 = *puVar2;
          uStack_70 = puVar2[1];
          puVar2 = (undefined8 *)((long)ptr + (uVar14 - 0x10));
          local_68 = *puVar2;
          uStack_60 = puVar2[1];
          uVar4 = puVar12[1];
          uVar5 = puVar12[2];
          uVar6 = puVar12[3];
          uVar7 = puVar12[4];
          uVar8 = puVar12[5];
          uVar9 = puVar12[6];
          uVar10 = puVar12[7];
          puVar2 = (undefined8 *)((long)ptr + (uVar14 - 0x40));
          *puVar2 = *puVar12;
          puVar2[1] = uVar4;
          puVar2 = (undefined8 *)((long)ptr + (uVar14 - 0x10));
          *puVar2 = uVar9;
          puVar2[1] = uVar10;
          puVar2 = (undefined8 *)((long)ptr + (uVar14 - 0x20));
          *puVar2 = uVar7;
          puVar2[1] = uVar8;
          puVar2 = (undefined8 *)((long)ptr + (uVar14 - 0x30));
          *puVar2 = uVar5;
          puVar2[1] = uVar6;
          puVar12[6] = local_68;
          puVar12[7] = uStack_60;
          puVar12[4] = local_78;
          puVar12[5] = uStack_70;
          puVar12[2] = local_88;
          puVar12[3] = uStack_80;
          *puVar12 = local_98;
          puVar12[1] = uStack_90;
          puVar12 = puVar12 + -8;
          uVar14 = uVar13;
        } while (0x40 < uVar13);
      }
      uVar14 = count - 1;
      pvVar15 = (void *)(uVar14 * size + (long)ptr);
      memcpy(&local_98,ptr,uVar13);
      memmove(ptr,pvVar15,uVar13);
      memcpy(pvVar15,&local_98,uVar13);
      bVar21 = count != 2;
      count = uVar14;
      if (bVar21) {
        local_40 = uVar14 >> 1;
        uVar13 = 0;
        local_38 = uVar14;
        do {
          count = local_38;
          uVar3 = uVar13 * 2;
          uVar14 = uVar13 * 2 + 2;
          if (uVar14 < local_38) {
            pvVar15 = (void *)(uVar14 * size + (long)ptr);
            iVar11 = (*cmp)(pvVar15,(void *)((uVar3 | 1) * size + (long)ptr),cmp_data);
            if (iVar11 < 0) goto LAB_001182b5;
            pvVar17 = (void *)(uVar13 * size + (long)ptr);
            iVar11 = (*cmp)(pvVar15,pvVar17,cmp_data);
            if (iVar11 < 1) break;
            sVar20 = size;
            if (0x40 < size) {
              lVar18 = (uVar3 + 3) * size;
              lVar16 = (uVar13 + 1) * size;
              lVar19 = 0;
              do {
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x40);
                local_98 = *puVar12;
                uStack_90 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x30);
                local_88 = *puVar12;
                uStack_80 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x20);
                local_78 = *puVar12;
                uStack_70 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x10);
                local_68 = *puVar12;
                uStack_60 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x40);
                uVar4 = puVar12[1];
                puVar2 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x30);
                uVar5 = *puVar2;
                uVar6 = puVar2[1];
                puVar2 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x20);
                uVar7 = *puVar2;
                uVar8 = puVar2[1];
                puVar2 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x10);
                uVar9 = *puVar2;
                uVar10 = puVar2[1];
                puVar2 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x40);
                *puVar2 = *puVar12;
                puVar2[1] = uVar4;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x10);
                *puVar12 = uVar9;
                puVar12[1] = uVar10;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x20);
                *puVar12 = uVar7;
                puVar12[1] = uVar8;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x30);
                *puVar12 = uVar5;
                puVar12[1] = uVar6;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x10);
                *puVar12 = local_68;
                puVar12[1] = uStack_60;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x20);
                *puVar12 = local_78;
                puVar12[1] = uStack_70;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x30);
                *puVar12 = local_88;
                puVar12[1] = uStack_80;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x40);
                *puVar12 = local_98;
                puVar12[1] = uStack_90;
                lVar1 = size + lVar19;
                lVar19 = lVar19 + -0x40;
              } while (0x40 < lVar1 - 0x40U);
              sVar20 = lVar19 + size;
            }
            memcpy(&local_98,pvVar17,sVar20);
            memmove(pvVar17,pvVar15,sVar20);
            memcpy(pvVar15,&local_98,sVar20);
            uVar13 = uVar14;
          }
          else {
LAB_001182b5:
            pvVar17 = (void *)((uVar3 | 1) * size + (long)ptr);
            pvVar15 = (void *)(uVar13 * size + (long)ptr);
            iVar11 = (*cmp)(pvVar17,pvVar15,cmp_data);
            if (iVar11 < 1) break;
            sVar20 = size;
            if (0x40 < size) {
              lVar18 = uVar14 * size;
              lVar16 = (uVar13 + 1) * size;
              lVar19 = 0;
              do {
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x40);
                local_98 = *puVar12;
                uStack_90 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x30);
                local_88 = *puVar12;
                uStack_80 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x20);
                local_78 = *puVar12;
                uStack_70 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x10);
                local_68 = *puVar12;
                uStack_60 = puVar12[1];
                puVar2 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x40);
                uVar4 = puVar2[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x30);
                uVar5 = *puVar12;
                uVar6 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x20);
                uVar7 = *puVar12;
                uVar8 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x10);
                uVar9 = *puVar12;
                uVar10 = puVar12[1];
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x40);
                *puVar12 = *puVar2;
                puVar12[1] = uVar4;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x10);
                *puVar12 = uVar9;
                puVar12[1] = uVar10;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x20);
                *puVar12 = uVar7;
                puVar12[1] = uVar8;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar16 + -0x30);
                *puVar12 = uVar5;
                puVar12[1] = uVar6;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x10);
                *puVar12 = local_68;
                puVar12[1] = uStack_60;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x20);
                *puVar12 = local_78;
                puVar12[1] = uStack_70;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x30);
                *puVar12 = local_88;
                puVar12[1] = uStack_80;
                puVar12 = (undefined8 *)((long)ptr + lVar19 + lVar18 + -0x40);
                *puVar12 = local_98;
                puVar12[1] = uStack_90;
                lVar1 = size + lVar19;
                lVar19 = lVar19 + -0x40;
              } while (0x40 < lVar1 - 0x40U);
              sVar20 = lVar19 + size;
            }
            memcpy(&local_98,pvVar15,sVar20);
            memmove(pvVar15,pvVar17,sVar20);
            memcpy(pvVar17,&local_98,sVar20);
            uVar13 = uVar3 | 1;
          }
          count = local_38;
        } while (uVar13 < local_40);
      }
      local_48 = (undefined8 *)((long)local_48 + local_50);
    } while (1 < count);
  }
  return;
}

Assistant:

static void secp256k1_hsort(void *ptr, size_t count, size_t size,
                            int (*cmp)(const void *, const void *, void *),
                            void *cmp_data) {
    size_t i;

    for (i = count/2; 0 < i; --i) {
        secp256k1_heap_down(ptr, i-1, count, size, cmp, cmp_data);
    }
    for (i = count; 1 < i; --i) {
        /* Extract the largest value from the heap */
        secp256k1_heap_swap(ptr, 0, i-1, size);

        /* Repair the heap condition */
        secp256k1_heap_down(ptr, 0, i-1, size, cmp, cmp_data);
    }
}